

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_tests.c
# Opt level: O2

void C_A_T_C_H_T_E_S_T_12(void)

{
  SourceLineInfo local_150;
  int *test2;
  char *local_138;
  undefined8 local_130;
  AssertionHandler catchAssertionHandler;
  void *local_c0;
  Test *test;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  test = (Test *)0x0;
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x58;
  Catch::StringRef::StringRef(&local_40,"test == __null");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_40,Normal);
  test2 = (int *)0x0;
  local_150.file = (char *)&test;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            ((BinaryExpr<Test_*const_&,_const_long_&> *)&local_138,
             (ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&> *)&local_150,(long *)&test2);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x59;
  Catch::StringRef::StringRef(&local_50,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_50,Normal);
  test2 = (int *)0x0;
  local_150.file = (char *)&test;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            ((BinaryExpr<Test_*const_&,_const_std::nullptr_t_&> *)&local_138,
             (ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&> *)&local_150,&test2);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  test = (Test *)0x0;
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x5d;
  Catch::StringRef::StringRef(&local_60,"test == __null");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_60,Normal);
  test2 = (int *)0x0;
  local_150.file = (char *)&test;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            ((BinaryExpr<Test_*const_&,_const_long_&> *)&local_138,
             (ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&> *)&local_150,(long *)&test2);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x5e;
  Catch::StringRef::StringRef(&local_70,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_70,Normal);
  test2 = (int *)0x0;
  local_150.file = (char *)&test;
  Catch::ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&>::operator==
            ((BinaryExpr<Test_*const_&,_const_std::nullptr_t_&> *)&local_138,
             (ExprLhs<C_A_T_C_H_T_E_S_T_12()::Test*const&> *)&local_150,&test2);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  test2 = (int *)0x0;
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x62;
  Catch::StringRef::StringRef(&local_80,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_80,Normal);
  local_c0 = (void *)0x0;
  local_150.file = (char *)&test2;
  Catch::ExprLhs<int*const&>::operator==
            ((BinaryExpr<int_*const_&,_const_long_&> *)&local_138,(ExprLhs<int*const&> *)&local_150,
             (long *)&local_c0);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 99;
  Catch::StringRef::StringRef(&local_90,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_90,Normal);
  local_c0 = (void *)0x0;
  local_150.file = (char *)&test2;
  Catch::ExprLhs<int*const&>::operator==
            ((BinaryExpr<int_*const_&,_const_std::nullptr_t_&> *)&local_138,
             (ExprLhs<int*const&> *)&local_150,&local_c0);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  test2 = (int *)0x0;
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x67;
  Catch::StringRef::StringRef(&local_a0,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_a0,Normal);
  local_c0 = (void *)0x0;
  local_150.file = (char *)&test2;
  Catch::ExprLhs<int*const&>::operator==
            ((BinaryExpr<int_*const_&,_const_long_&> *)&local_138,(ExprLhs<int*const&> *)&local_150,
             (long *)&local_c0);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_138 = "REQUIRE";
  local_130 = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_150.line = 0x68;
  Catch::StringRef::StringRef(&local_b0,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_138,&local_150,local_b0,Normal);
  local_c0 = (void *)0x0;
  local_150.file = (char *)&test2;
  Catch::ExprLhs<int*const&>::operator==
            ((BinaryExpr<int_*const_&,_const_std::nullptr_t_&> *)&local_138,
             (ExprLhs<int*const&> *)&local_150,&local_c0);
  Catch::AssertionHandler::handleExpr((ITransientExpression *)&catchAssertionHandler);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&local_138);
  Catch::AssertionHandler::complete();
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

class Test
	{
		Test()
		{
		}
	}